

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O1

void __thiscall
bwtil::cw_bwt::cw_bwt(cw_bwt *this,string *input_string,cw_bwt_input_type input_type,bool verbose)

{
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar1;
  pointer puVar2;
  pointer puVar3;
  int iVar4;
  BackwardFileIterator *this_00;
  undefined4 extraout_var;
  EVP_PKEY_CTX *ctx;
  pointer pvVar7;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 local_e8 [88];
  pointer puStack_90;
  pointer local_88;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_80;
  ulint local_68;
  uint uStack_60;
  uint uStack_5c;
  ulint uStack_58;
  ulint uStack_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   &(this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = auVar5;
  (this->ca).inverse_remapping =
       (vector<unsigned_char,_std::allocator<unsigned_char>_>)auVar5._0_24_;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->ca).prefix_nr = (vector<unsigned_int,_std::allocator<unsigned_int>_>)auVar5._0_24_;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  *(undefined1 (*) [32])
   &(this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = auVar5;
  auVar6 = ZEXT464(0) << 0x40;
  this->partial_sums =
       (vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>)auVar6._0_24_;
  this->dynStrings =
       (vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
        )auVar6._24_24_;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar6._48_8_;
  (this->frequencies).
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar6._56_8_;
  *(undefined1 (*) [64])
   &(this->dynStrings).
    super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar6;
  this->verbose = verbose;
  if (input_type == path) {
    this_00 = (BackwardFileIterator *)operator_new(0x60);
    BackwardFileIterator::BackwardFileIterator(this_00,input_string);
  }
  else {
    this_00 = (BackwardFileIterator *)operator_new(0x30);
    BackwardStringIterator::BackwardStringIterator((BackwardStringIterator *)this_00,input_string);
  }
  this->bwIt = &this_00->super_BackwardIterator;
  iVar4 = (*(this_00->super_BackwardIterator)._vptr_BackwardIterator[6])(this_00);
  this->n = CONCAT44(extraout_var,iVar4);
  ctx = (EVP_PKEY_CTX *)this->bwIt;
  ContextAutomata::ContextAutomata((ContextAutomata *)local_e8,(BackwardIterator *)ctx,10,verbose);
  *(undefined8 *)&this->ca = local_e8._0_8_;
  (this->ca).bwIt = (BackwardIterator *)local_e8._8_8_;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._32_8_;
  puVar2 = (this->ca).inverse_remapping.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_e8._16_8_;
  (this->ca).inverse_remapping.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)local_e8._24_8_;
  local_e8._16_8_ = (pointer)0x0;
  local_e8._24_8_ = (pointer)0x0;
  local_e8._32_8_ = (pointer)0x0;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_e8._56_8_;
  puVar3 = (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_e8._40_8_;
  (this->ca).remapping.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_e8._48_8_;
  local_e8._40_8_ = (pointer)0x0;
  local_e8._48_8_ = (pointer)0x0;
  local_e8._56_8_ = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
  }
  (this->ca).null_ptr = local_e8._72_4_;
  (this->ca).current_state = local_e8._64_8_;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_88;
  puVar3 = (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_e8._80_8_;
  (this->ca).prefix_nr.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = puStack_90;
  register0x00001200 = ZEXT816(0) << 0x20;
  pvVar7 = SUB168(ZEXT816(0),4);
  local_88 = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3);
    pvVar7 = (pointer)0x0;
  }
  pvVar1 = &(this->ca).edges;
  local_48._0_8_ =
       (pvVar1->
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_48._8_8_ =
       (pvVar1->
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (this->ca).edges.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_80.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_80.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->ca).edges.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_80.
       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_80.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_48);
  (this->ca).number_of_k_mers = local_68;
  (this->ca).sigma = uStack_60;
  (this->ca).k = uStack_5c;
  (this->ca).sigma_pow_k_minus_one = uStack_58;
  (this->ca).n = uStack_50;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_80);
  if ((pointer)local_e8._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._80_8_);
  }
  if ((pointer)local_e8._40_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._40_8_);
  }
  if ((pointer)local_e8._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._16_8_);
  }
  this->k = (this->ca).k;
  init(this,ctx);
  if (this->bwIt != (BackwardIterator *)0x0) {
    (*this->bwIt->_vptr_BackwardIterator[1])();
  }
  return;
}

Assistant:

cw_bwt(string &input_string, cw_bwt_input_type input_type, bool verbose=false){

		this->verbose=verbose;

		if(input_type==path)
			bwIt = new BackwardFileIterator(input_string);
		else
			bwIt = new BackwardStringIterator(input_string);

		n = bwIt->length();

		ca = ContextAutomata(bwIt, 10, verbose);//Default automata overhead
		k = ca.contextLength();

		init();

		delete bwIt;

	}